

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSBuilder::addMemoryGrowFunc(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  pointer puVar1;
  ValueBuilder *this_00;
  size_t sVar2;
  char *pcVar3;
  ValueBuilder *this_01;
  size_t sVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  Ref RVar8;
  undefined8 *puVar9;
  Value *pVVar10;
  Ref RVar11;
  char *pcVar12;
  Value *pVVar13;
  Value *pVVar14;
  Ref RVar15;
  Ref RVar16;
  char *in_RCX;
  void *pvVar17;
  Ref in_R8;
  IString name;
  IString target;
  IString target_00;
  IString target_01;
  IString arg;
  IString op;
  IString name_00;
  IString op_00;
  IString name_01;
  IString op_01;
  IString op_02;
  IString op_03;
  IString name_02;
  IString name_03;
  IString key;
  IString op_04;
  IString op_05;
  IString op_06;
  IString op_07;
  IString op_08;
  IString op_09;
  IString op_10;
  IString op_11;
  IString op_12;
  IString op_13;
  IString op_14;
  undefined1 auVar18 [16];
  anon_union_16_6_a0c44491_for_Value_2 aVar19;
  Ref local_70;
  Ref memoryGrowFunc;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  
  name.str._M_str = (char *)wasm;
  name.str._M_len = _getGCData;
  RVar8 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_GROW,name);
  local_70 = RVar8;
  auVar18 = ::wasm::IString::interned(10,"pagesToAdd",0);
  arg.str._M_len = auVar18._8_8_;
  arg.str._M_str = in_RCX;
  cashew::ValueBuilder::appendArgumentToFunction((ValueBuilder *)RVar8.inst,auVar18._0_8_,arg);
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
  pVVar13 = (Value *)*puVar9;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(10,"pagesToAdd",0);
  pvVar17 = (void *)0x18;
  pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar10->type = Null;
  cashew::Value::free(pVVar10,pvVar17);
  pVVar10->type = String;
  pVVar10->field_1 = aVar19;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(10,"pagesToAdd",0);
  pvVar17 = (void *)0x18;
  RVar11.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar11.inst)->type = Null;
  cashew::Value::free(RVar11.inst,pvVar17);
  (RVar11.inst)->type = String;
  (RVar11.inst)->field_1 = aVar19;
  pcVar12 = (char *)makeJsCoercion(RVar11,JS_INT);
  op.str._M_str = pcVar12;
  op.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar10,RVar8,op,in_R8);
  cashew::Value::push_back(pVVar13,RVar8);
  RVar8 = cashew::ValueBuilder::makeVar(false);
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
  cashew::Value::push_back((Value *)*puVar9,RVar8);
  auVar18 = ::wasm::IString::interned(8,"oldPages",0);
  target.str._M_str = auVar18._8_8_;
  target.str._M_len = FUNCTION_TABLE;
  RVar11 = cashew::ValueBuilder::makeCall(WASM_MEMORY_SIZE,target);
  pcVar12 = (char *)makeJsCoercion(RVar11,JS_INT);
  name_00.str._M_str = pcVar12;
  name_00.str._M_len = (size_t)target.str._M_str;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar8.inst,auVar18._0_8_,name_00,in_R8);
  RVar8 = cashew::ValueBuilder::makeVar(false);
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
  cashew::Value::push_back((Value *)*puVar9,RVar8);
  auVar18 = ::wasm::IString::interned(8,"newPages",0);
  name_01.str._M_len = auVar18._8_8_;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"oldPages",0);
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  pVVar13->field_1 = aVar19;
  sVar2 = ___cxa_end_catch;
  memoryGrowFunc.inst = cashew::PLUS;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(10,"pagesToAdd",0);
  pvVar17 = (void *)0x18;
  pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar10->type = Null;
  cashew::Value::free(pVVar10,pvVar17);
  pVVar10->type = String;
  pVVar10->field_1 = aVar19;
  op_00.str._M_str = (char *)pVVar10;
  op_00.str._M_len = sVar2;
  RVar11 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,memoryGrowFunc,op_00,in_R8);
  pcVar12 = (char *)makeJsCoercion(RVar11,JS_INT);
  name_01.str._M_str = pcVar12;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar8.inst,auVar18._0_8_,name_01,in_R8);
  RVar11 = cashew::ValueBuilder::makeBlock();
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
  pVVar13 = (Value *)*puVar9;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"oldPages",0);
  pvVar17 = (void *)0x18;
  pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar10->type = Null;
  cashew::Value::free(pVVar10,pvVar17);
  pVVar10->type = String;
  pVVar10->field_1 = aVar19;
  sVar2 = _operator_;
  RVar8.inst = cashew::LT.inst;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"newPages",0);
  pvVar17 = (void *)0x18;
  pVVar14 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar14->type = Null;
  cashew::Value::free(pVVar14,pvVar17);
  pVVar14->type = String;
  pVVar14->field_1 = aVar19;
  op_01.str._M_str = (char *)pVVar14;
  op_01.str._M_len = sVar2;
  RVar15 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar10,RVar8,op_01,in_R8);
  auVar18 = ::wasm::IString::interned(2,"&&",0);
  op_03.str._M_len = auVar18._8_8_;
  memoryGrowFunc.inst = auVar18._0_8_;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"newPages",0);
  pvVar17 = (void *)0x18;
  pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar10->type = Null;
  cashew::Value::free(pVVar10,pvVar17);
  pVVar10->type = String;
  pVVar10->field_1 = aVar19;
  sVar2 = _operator_;
  RVar8.inst = cashew::LT.inst;
  pvVar17 = (void *)0x18;
  pVVar14 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar14->type = Null;
  cashew::Value::free(pVVar14,pvVar17);
  pVVar14->type = Number;
  (pVVar14->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  op_02.str._M_str = (char *)pVVar14;
  op_02.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar10,RVar8,op_02,in_R8);
  op_03.str._M_str = (char *)RVar8.inst;
  RVar8 = cashew::ValueBuilder::makeBinary(RVar15.inst,memoryGrowFunc,op_03,in_R8);
  RVar8 = cashew::ValueBuilder::makeIf(RVar8,RVar11,(Ref)0x0);
  cashew::Value::push_back(pVVar13,RVar8);
  RVar8 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  auVar18 = ::wasm::IString::interned(9,"newBuffer",0);
  sVar4 = cashew::CONDITIONAL;
  this_01 = MATH_IMUL;
  sVar2 = _isPassHidden;
  this_00 = ARRAY_BUFFER;
  memoryGrowFunc.inst = auVar18._8_8_;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"newPages",0);
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  pVVar13->field_1 = aVar19;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = Number;
  ((RVar15.inst)->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  target_00.str._M_str = (char *)pVVar13;
  target_00.str._M_len = sVar4;
  RVar16 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>(this_01,target_00,RVar15,in_R8);
  target_01.str._M_str = (char *)RVar16.inst;
  target_01.str._M_len = sVar2;
  RVar15 = cashew::ValueBuilder::makeCall<cashew::Ref>(this_00,target_01,RVar15);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  name_02.str._M_str = (char *)RVar15.inst;
  name_02.str._M_len = (size_t)memoryGrowFunc.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar8.inst,auVar18._0_8_,name_02,in_R8);
  RVar8 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  auVar18 = ::wasm::IString::interned(8,"newHEAP8",0);
  uVar6 = _getGlobal;
  name_03.str._M_len = auVar18._8_8_;
  memoryGrowFunc.inst = INT8ARRAY;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  uStack_60 = (undefined4)uVar6;
  uStack_5c = (undefined4)((ulong)uVar6 >> 0x20);
  *(undefined4 *)&(RVar15.inst)->field_1 = memoryGrowFunc.inst._0_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 4) = memoryGrowFunc.inst._4_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 8) = uStack_60;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 0xc) = uStack_5c;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  name_03.str._M_str = (char *)RVar15.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar8.inst,auVar18._0_8_,name_03,in_R8);
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"newHEAP8",0);
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  pVVar13->field_1 = aVar19;
  auVar18 = ::wasm::IString::interned(3,"set",0);
  key.str._M_len = auVar18._8_8_;
  key.str._M_str = (char *)RVar15.inst;
  RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar13,auVar18._0_8_,key);
  pcVar12 = cashew::HEAPF64;
  sVar2 = cashew::HEAP8;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).str.str._M_len = sVar2;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  RVar8 = cashew::ValueBuilder::makeCall(RVar8,RVar15);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  uVar6 = _getGlobal;
  pcVar12 = cashew::HEAPF64;
  sVar2 = cashew::HEAP8;
  memoryGrowFunc.inst = INT8ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar12;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  uStack_60 = (undefined4)uVar6;
  uStack_5c = (undefined4)((ulong)uVar6 >> 0x20);
  *(undefined4 *)&(RVar15.inst)->field_1 = memoryGrowFunc.inst._0_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 4) = memoryGrowFunc.inst._4_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 8) = uStack_60;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 0xc) = uStack_5c;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_04.str._M_str = (char *)RVar15.inst;
  op_04.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_04,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  uVar6 = _hasLocalName;
  pcVar3 = __stringstream;
  pcVar12 = cashew::HEAP16;
  memoryGrowFunc.inst = INT16ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = (size_t)pcVar12;
  (pVVar13->field_1).str.str._M_str = pcVar3;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  uStack_60 = (undefined4)uVar6;
  uStack_5c = (undefined4)((ulong)uVar6 >> 0x20);
  *(undefined4 *)&(RVar15.inst)->field_1 = memoryGrowFunc.inst._0_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 4) = memoryGrowFunc.inst._4_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 8) = uStack_60;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 0xc) = uStack_5c;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_05.str._M_str = (char *)RVar15.inst;
  op_05.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_05,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  uVar6 = _addDefaultOptimizationPasses;
  pcVar12 = cashew::HEAP16;
  sVar2 = cashew::HEAP32;
  memoryGrowFunc.inst = INT32ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar12;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  uStack_60 = (undefined4)uVar6;
  uStack_5c = (undefined4)((ulong)uVar6 >> 0x20);
  *(undefined4 *)&(RVar15.inst)->field_1 = memoryGrowFunc.inst._0_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 4) = memoryGrowFunc.inst._4_4_;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 8) = uStack_60;
  *(undefined4 *)((long)&(RVar15.inst)->field_1 + 0xc) = uStack_5c;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_06.str._M_str = (char *)RVar15.inst;
  op_06.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_06,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar3 = _getNumLocals;
  sVar2 = cashew::HEAPU8;
  pcVar12 = _VTT;
  memoryGrowFunc.inst = UINT8ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar3;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_07.str._M_str = (char *)RVar15.inst;
  op_07.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_07,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar3 = __M_append;
  sVar2 = cashew::HEAPU16;
  pcVar12 = _stringstream;
  memoryGrowFunc.inst = UINT16ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar3;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_08.str._M_str = (char *)RVar15.inst;
  op_08.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_08,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar3 = ASM_FUNC;
  sVar2 = cashew::HEAPU32;
  pcVar12 = cashew::LSHIFT;
  memoryGrowFunc.inst = UINT32ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar3;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_09.str._M_str = (char *)RVar15.inst;
  op_09.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_09,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar3 = MIN;
  sVar2 = cashew::HEAPF32;
  pcVar12 = _memcpy;
  memoryGrowFunc.inst = FLOAT32ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar3;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_10.str._M_str = (char *)RVar15.inst;
  op_10.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_10,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar5 = _VTT;
  pcVar3 = cashew::HEAPF64;
  pcVar12 = _put;
  memoryGrowFunc.inst = FLOAT64ARRAY;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = (size_t)pcVar3;
  (pVVar13->field_1).str.str._M_str = pcVar5;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  pvVar17 = (void *)0x18;
  RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar15.inst)->type = Null;
  cashew::Value::free(RVar15.inst,pvVar17);
  (RVar15.inst)->type = String;
  ((RVar15.inst)->field_1).ref.inst = memoryGrowFunc.inst;
  ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  RVar16.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar16.inst)->type = Null;
  cashew::Value::free(RVar16.inst,pvVar17);
  (RVar16.inst)->type = String;
  (RVar16.inst)->field_1 = aVar19;
  RVar15 = cashew::ValueBuilder::makeCall(RVar15,RVar16);
  RVar15 = cashew::ValueBuilder::makeNew(RVar15);
  op_11.str._M_str = (char *)RVar15.inst;
  op_11.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_11,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  pcVar12 = cashew::LOAD;
  sVar2 = BUFFER;
  pvVar17 = (void *)0x18;
  pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar13->type = Null;
  cashew::Value::free(pVVar13,pvVar17);
  pVVar13->type = String;
  (pVVar13->field_1).str.str._M_len = sVar2;
  (pVVar13->field_1).str.str._M_str = pcVar12;
  sVar2 = BLOCK;
  RVar8.inst = cashew::SET.inst;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(9,"newBuffer",0);
  pvVar17 = (void *)0x18;
  pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar10->type = Null;
  cashew::Value::free(pVVar10,pvVar17);
  pVVar10->type = String;
  pVVar10->field_1 = aVar19;
  op_12.str._M_str = (char *)pVVar10;
  op_12.str._M_len = sVar2;
  RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_12,in_R8);
  cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&(((puVar1->_M_t).
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable).module + 8) != (char *)0x0)) {
    aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"memory",0);
    pvVar17 = (void *)0x18;
    RVar8.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar8.inst)->type = Null;
    cashew::Value::free(RVar8.inst,pvVar17);
    (RVar8.inst)->type = String;
    (RVar8.inst)->field_1 = aVar19;
    pcVar12 = cashew::LOAD;
    sVar2 = BUFFER;
    pvVar17 = (void *)0x18;
    RVar15.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar15.inst)->type = Null;
    cashew::Value::free(RVar15.inst,pvVar17);
    (RVar15.inst)->type = String;
    ((RVar15.inst)->field_1).str.str._M_len = sVar2;
    ((RVar15.inst)->field_1).str.str._M_str = pcVar12;
    RVar15 = cashew::ValueBuilder::makeDot(RVar8,RVar15);
    pcVar12 = cashew::LOAD;
    sVar4 = BUFFER;
    sVar2 = BLOCK;
    RVar8.inst = cashew::SET.inst;
    pvVar17 = (void *)0x18;
    pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar13->type = Null;
    cashew::Value::free(pVVar13,pvVar17);
    pVVar13->type = String;
    (pVVar13->field_1).str.str._M_len = sVar4;
    (pVVar13->field_1).str.str._M_str = pcVar12;
    op_13.str._M_str = (char *)pVVar13;
    op_13.str._M_len = sVar2;
    RVar8 = cashew::ValueBuilder::makeBinary(RVar15.inst,RVar8,op_13,in_R8);
    cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  }
  bVar7 = needsBufferView(wasm);
  if (bVar7) {
    aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(10,"bufferView",0);
    pvVar17 = (void *)0x18;
    pVVar13 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar13->type = Null;
    cashew::Value::free(pVVar13,pvVar17);
    pVVar13->type = String;
    pVVar13->field_1 = aVar19;
    sVar4 = BLOCK;
    RVar8.inst = cashew::SET.inst;
    pcVar12 = _getNumLocals;
    sVar2 = cashew::HEAPU8;
    pvVar17 = (void *)0x18;
    pVVar10 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar10->type = Null;
    cashew::Value::free(pVVar10,pvVar17);
    pVVar10->type = String;
    (pVVar10->field_1).str.str._M_len = sVar2;
    (pVVar10->field_1).str.str._M_str = pcVar12;
    op_14.str._M_str = (char *)pVVar10;
    op_14.str._M_len = sVar4;
    RVar8 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar13,RVar8,op_14,in_R8);
    cashew::ValueBuilder::appendToBlock(RVar11,RVar8);
  }
  puVar9 = (undefined8 *)cashew::Ref::operator[]((uint)&local_70);
  pVVar13 = (Value *)*puVar9;
  aVar19 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(8,"oldPages",0);
  pvVar17 = (void *)0x18;
  RVar8.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (RVar8.inst)->type = Null;
  cashew::Value::free(RVar8.inst,pvVar17);
  (RVar8.inst)->type = String;
  (RVar8.inst)->field_1 = aVar19;
  RVar8 = cashew::ValueBuilder::makeReturn(RVar8);
  cashew::Value::push_back(pVVar13,RVar8);
  cashew::Value::push_back(ast.inst,local_70);
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryGrowFunc(Ref ast, Module* wasm) {
  Ref memoryGrowFunc = ValueBuilder::makeFunction(WASM_MEMORY_GROW);
  ValueBuilder::appendArgumentToFunction(memoryGrowFunc, IString("pagesToAdd"));

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeBinary(
      ValueBuilder::makeName(IString("pagesToAdd")),
      SET,
      makeJsCoercion(ValueBuilder::makeName(IString("pagesToAdd")),
                     JsType::JS_INT))));

  Ref oldPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(oldPages);
  ValueBuilder::appendToVar(
    oldPages,
    IString("oldPages"),
    makeJsCoercion(ValueBuilder::makeCall(WASM_MEMORY_SIZE), JsType::JS_INT));

  Ref newPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(newPages);
  ValueBuilder::appendToVar(
    newPages,
    IString("newPages"),
    makeJsCoercion(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               PLUS,
                               ValueBuilder::makeName(IString("pagesToAdd"))),
      JsType::JS_INT));

  Ref block = ValueBuilder::makeBlock();
  memoryGrowFunc[3]->push_back(ValueBuilder::makeIf(
    ValueBuilder::makeBinary(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               LT,
                               ValueBuilder::makeName(IString("newPages"))),
      IString("&&"),
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("newPages")),
                               LT,
                               ValueBuilder::makeInt(Memory::kMaxSize32))),
    block,
    NULL));

  Ref newBuffer = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newBuffer);
  ValueBuilder::appendToVar(
    newBuffer,
    IString("newBuffer"),
    ValueBuilder::makeNew(ValueBuilder::makeCall(
      ARRAY_BUFFER,
      ValueBuilder::makeCall(MATH_IMUL,
                             ValueBuilder::makeName(IString("newPages")),
                             ValueBuilder::makeInt(Memory::kPageSize)))));

  Ref newHEAP8 = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newHEAP8);
  ValueBuilder::appendToVar(newHEAP8,
                            IString("newHEAP8"),
                            ValueBuilder::makeNew(ValueBuilder::makeCall(
                              ValueBuilder::makeName(INT8ARRAY),
                              ValueBuilder::makeName(IString("newBuffer")))));

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeCall(
      ValueBuilder::makeDot(ValueBuilder::makeName(IString("newHEAP8")),
                            IString("set")),
      ValueBuilder::makeName(HEAP8)));

  auto setHeap = [&](IString name, IString view) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeName(name),
        SET,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName(view),
          ValueBuilder::makeName(IString("newBuffer"))))));
  };

  setHeap(HEAP8, INT8ARRAY);
  setHeap(HEAP16, INT16ARRAY);
  setHeap(HEAP32, INT32ARRAY);
  setHeap(HEAPU8, UINT8ARRAY);
  setHeap(HEAPU16, UINT16ARRAY);
  setHeap(HEAPU32, UINT32ARRAY);
  setHeap(HEAPF32, FLOAT32ARRAY);
  setHeap(HEAPF64, FLOAT64ARRAY);

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeBinary(ValueBuilder::makeName(BUFFER),
                             SET,
                             ValueBuilder::makeName(IString("newBuffer"))));

  // apply the changes to the memory import
  if (!wasm->memories.empty() && wasm->memories[0]->imported()) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName(BUFFER)),
        SET,
        ValueBuilder::makeName(BUFFER)));
  }

  if (needsBufferView(*wasm)) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeReturn(ValueBuilder::makeName(IString("oldPages"))));

  ast->push_back(memoryGrowFunc);
}